

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d16_h8_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  int in_R8D;
  byte in_stack_00000008;
  __m256i ff [4];
  __m256i max;
  __m256i res1;
  __m256i res0;
  __m256i signal [8];
  undefined6 in_stack_fffffffffffffd58;
  __m256i *in_stack_fffffffffffffd60;
  __m256i *in_stack_fffffffffffffd68;
  __m256i *in_stack_fffffffffffffd70;
  __m256i *in_stack_fffffffffffffd88;
  uint16_t *in_stack_fffffffffffffd90;
  __m256i *in_stack_fffffffffffffe00;
  __m256i *in_stack_fffffffffffffe08;
  undefined4 local_ac;
  undefined8 uStack_68;
  
  uVar3 = (short)(1 << (in_stack_00000008 & 0x1f)) - 1;
  auVar1 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar3,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar3),(uint)uVar3,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar3,6);
  vpinsrw_avx(auVar2,(uint)uVar3,7);
  uStack_68 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,8);
  pack_filters((int16_t *)in_stack_fffffffffffffe00,uStack_68);
  local_ac = in_R8D;
  do {
    pack_16x1_pixels(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    filter_8x1_pixels(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,uStack_68);
    filter_8x1_pixels(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,uStack_68);
    store_16x1_pixels(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                      (uint16_t *)CONCAT26(uVar3,in_stack_fffffffffffffd58));
    local_ac = local_ac + -1;
  } while (local_ac != 0);
  return;
}

Assistant:

static void aom_highbd_filter_block1d16_h8_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m256i signal[8], res0, res1;
  const __m256i max = _mm256_set1_epi16((1 << bd) - 1);

  __m256i ff[4];
  pack_filters(filter, ff);

  src_ptr -= 3;
  do {
    pack_16x1_pixels(src_ptr, signal);
    filter_8x1_pixels(signal, ff, &res0);
    filter_8x1_pixels(&signal[4], ff, &res1);
    store_16x1_pixels(&res0, &res1, &max, dst_ptr);
    height -= 1;
    src_ptr += src_pitch;
    dst_ptr += dst_pitch;
  } while (height > 0);
}